

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolj.c
# Opt level: O0

int ffggpjj(fitsfile *fptr,long group,long firstelem,long nelem,LONGLONG *array,int *status)

{
  LONGLONG local_68;
  LONGLONG dummy;
  char cdummy;
  LONGLONG LStack_50;
  int idummy;
  long row;
  int *status_local;
  LONGLONG *array_local;
  long nelem_local;
  long firstelem_local;
  long group_local;
  fitsfile *fptr_local;
  
  local_68 = group;
  if (group < 1) {
    local_68 = 1;
  }
  LStack_50 = local_68;
  row = (long)status;
  status_local = (int *)array;
  array_local = (LONGLONG *)nelem;
  nelem_local = firstelem;
  firstelem_local = group;
  group_local = (long)fptr;
  ffgcljj(fptr,1,local_68,firstelem,nelem,1,1,0,array,(char *)((long)&dummy + 3),
          (int *)((long)&dummy + 4),status);
  return *(int *)row;
}

Assistant:

int ffggpjj(fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to read (1 = 1st group)           */
            long  firstelem,  /* I - first vector element to read (1 = 1st)  */
            long  nelem,      /* I - number of values to read                */
            LONGLONG  *array, /* O - array of values that are returned       */
            int  *status)     /* IO - error status                           */
/*
  Read an array of group parameters from the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
*/
{
    long row;
    int idummy;
    char cdummy;
    LONGLONG dummy = 0;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffgcljj(fptr, 1, row, firstelem, nelem, 1, 1, dummy,
               array, &cdummy, &idummy, status);
    return(*status);
}